

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

SVInt __thiscall
slang::ast::slicePacked
          (ast *this,PackIterator *iter,PackIterator iterEnd,bitwidth_t *bit,bitwidth_t width)

{
  ast aVar1;
  ast aVar2;
  uint uVar3;
  uint uVar4;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar5;
  int iVar6;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar7;
  int lsb;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  SVInt SVar11;
  ConstantValue cp;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  anon_class_8_1_8991fb9c_conflict local_58;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_50;
  
  if (*iter == iterEnd) {
    *bit = *bit + width;
    SVInt::SVInt((SVInt *)this,width,0,false);
    uVar8 = extraout_RDX;
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_80,
                      (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)**iter);
    if (local_80._M_index == '\x06') {
      ConstantValue::convertToInt((ConstantValue *)&local_50,(ConstantValue *)&local_80);
      local_58.this =
           (_Move_assign_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            *)&local_80;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
        ::_S_vtable._M_arr[(long)(char)local_50._M_index + 1]._M_data)
                (&local_58,
                 (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  *)&local_50);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_50);
    }
    pvVar5 = std::
             get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_80);
    uVar3 = *bit;
    uVar4 = (pvVar5->super_SVIntStorage).bitWidth;
    if (uVar4 <= uVar3) {
      assert::assertFailed
                ("bit < ci.getBitWidth()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                 ,0x12a,
                 "SVInt slang::ast::slicePacked(PackIterator &, const PackIterator, bitwidth_t &, bitwidth_t)"
                );
    }
    lsb = ~uVar3 + uVar4;
    uVar9 = width + uVar3;
    iVar6 = uVar4 - uVar9;
    if (uVar4 < uVar9) {
      iVar6 = 0;
    }
    uVar10 = (uVar3 - iVar6) + lsb + 1;
    *bit = uVar10;
    uVar3 = (pvVar5->super_SVIntStorage).bitWidth;
    if (uVar3 < uVar10) {
      assert::assertFailed
                ("bit <= ci.getBitWidth()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                 ,0x130,
                 "SVInt slang::ast::slicePacked(PackIterator &, const PackIterator, bitwidth_t &, bitwidth_t)"
                );
    }
    if (uVar10 == uVar3) {
      *iter = *iter + 1;
      *bit = 0;
    }
    if ((uVar9 < uVar4) || (uVar3 = (pvVar5->super_SVIntStorage).bitWidth, lsb != uVar3 - 1)) {
      SVInt::slice((SVInt *)this,(int32_t)pvVar5,lsb);
    }
    else {
      aVar1 = (ast)(pvVar5->super_SVIntStorage).signFlag;
      aVar2 = (ast)(pvVar5->super_SVIntStorage).unknownFlag;
      *(undefined8 *)this = 0;
      *(uint *)(this + 8) = uVar3;
      this[0xc] = aVar1;
      this[0xd] = aVar2;
      if (uVar3 < 0x41 && ((byte)aVar2 & 1) == 0) {
        aVar7 = (pvVar5->super_SVIntStorage).field_0;
      }
      else {
        aVar7 = (pvVar5->super_SVIntStorage).field_0;
        (pvVar5->super_SVIntStorage).field_0.val = 0;
      }
      *(anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)this = aVar7;
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_80);
    uVar8 = extraout_RDX_00;
  }
  SVar11.super_SVIntStorage.bitWidth = (int)uVar8;
  SVar11.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar8 >> 0x20);
  SVar11.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar8 >> 0x28);
  SVar11.super_SVIntStorage._14_2_ = (short)((ulong)uVar8 >> 0x30);
  SVar11.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar11.super_SVIntStorage;
}

Assistant:

static SVInt slicePacked(PackIterator& iter, const PackIterator iterEnd, bitwidth_t& bit,
                         bitwidth_t width) {
    if (iter == iterEnd) {
        // Only for implicit streaming concatenation conversion
        bit += width;                  // Informs the caller how many zeros are appended.
        return SVInt(width, 0, false); // filling with zero bits on the right
    }

    ConstantValue cp = **iter;
    if (cp.isString())
        cp = cp.convertToInt();

    auto& ci = cp.integer();
    ASSERT(bit < ci.getBitWidth());
    bitwidth_t msb = ci.getBitWidth() - bit - 1;
    bitwidth_t lsb = std::min(bit + width, ci.getBitWidth());
    lsb = ci.getBitWidth() - lsb;
    bit += msb - lsb + 1;

    ASSERT(bit <= ci.getBitWidth());
    if (bit == ci.getBitWidth()) {
        iter++;
        bit = 0;
    }

    if (lsb == 0 && msb == ci.getBitWidth() - 1)
        return std::move(ci);

    return ci.slice(static_cast<int32_t>(msb), static_cast<int32_t>(lsb));
}